

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O1

UINT8 ym2612_read(void *chip,UINT8 a)

{
  return *(UINT8 *)((long)chip + 0x22f);
}

Assistant:

UINT8 ym2612_read(void *chip, UINT8 a)
{
	YM2612 *F2612 = (YM2612 *)chip;

	switch( a&3)
	{
	case 0: /* status 0 : YM2203 compatible */
		return FM_STATUS_FLAG(&F2612->OPN.ST);
	case 1:
	case 2:
	case 3:
		//emu_logf(&F2612->OPN.logger, DEVLOG_WARN, "A=%d read unmapped area\n", a);
		return FM_STATUS_FLAG(&F2612->OPN.ST);
	}
	return 0;
}